

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walletdb.h
# Opt level: O0

void wallet::CKeyMetadata::SerializationOps<DataStream,wallet::CKeyMetadata,ActionUnserialize>
               (DataStream *param_1,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *param_2)

{
  long lVar1;
  long in_FS_OFFSET;
  DataStream *in_stack_ffffffffffffffd8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ActionUnserialize::SerReadWriteMany<DataStream,int&,long&>
            (param_1,(int *)param_2,(long *)in_stack_ffffffffffffffd8);
  if (9 < *(int *)&(param_1->vch).
                   super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
                   super__Vector_impl_data._M_start) {
    ActionUnserialize::SerReadWriteMany<DataStream,std::__cxx11::string&,CKeyID&>
              (param_1,param_2,(CKeyID *)in_stack_ffffffffffffffd8);
  }
  if (0xb < *(int *)&(param_1->vch).
                     super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
                     super__Vector_impl_data._M_start) {
    ActionUnserialize::SerReadWriteMany<DataStream,KeyOriginInfo&>
              (in_stack_ffffffffffffffd8,(KeyOriginInfo *)0x2fa66b);
    ActionUnserialize::SerReadWriteMany<DataStream,bool&>
              (in_stack_ffffffffffffffd8,(bool *)0x2fa67e);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

SERIALIZE_METHODS(CKeyMetadata, obj)
    {
        READWRITE(obj.nVersion, obj.nCreateTime);
        if (obj.nVersion >= VERSION_WITH_HDDATA) {
            READWRITE(obj.hdKeypath, obj.hd_seed_id);
        }
        if (obj.nVersion >= VERSION_WITH_KEY_ORIGIN)
        {
            READWRITE(obj.key_origin);
            READWRITE(obj.has_key_origin);
        }
    }